

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O1

size_t __thiscall VFS::CVFS::CVFSFile::Read(CVFSFile *this,char *Buf,size_t Size,size_t CurPos)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar3;
  long lVar4;
  element_type *peVar5;
  element_type *extraout_RAX;
  ulong uVar6;
  ulong uVar7;
  mutex *__mutex;
  string *Path;
  ulong uVar8;
  VFSNode VVar9;
  _Alloc_hider _Stack_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  ulong local_58;
  
  __mutex = &(this->super_CVFSNode).m_UpdateLock;
  uVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (uVar3 != 0) {
    Path = (string *)(ulong)uVar3;
    std::__throw_system_error(uVar3);
    VVar9 = GetNodeInfo((CVFS *)&_Stack_78,Path);
    peVar5 = VVar9.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      peVar5 = extraout_RAX;
    }
    return CONCAT71((int7)((ulong)peVar5 >> 8),_Stack_78._M_p != (pointer)0x0);
  }
  uVar8 = CurPos >> 0xc;
  local_58 = 0;
  do {
    if ((Size <= local_58) ||
       (psVar1 = (this->m_Data).
                 super__Vector_base<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (ulong)((long)(this->m_Data).
                     super__Vector_base<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar8))
    break;
    peVar2 = psVar1[uVar8].
             super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = psVar1[uVar8].
              super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    uVar6 = CurPos + uVar8 * -0x1000;
    uVar7 = 0;
    if (uVar6 < 0x1001) {
      uVar7 = uVar6;
    }
    uVar3 = peVar2->Filled - (int)uVar7;
    if (Size <= (ulong)(long)(int)uVar3) {
      uVar3 = (uint)Size;
    }
    if (0 < (int)uVar3) {
      memcpy(Buf + local_58,peVar2->Data + uVar7,(ulong)(uVar3 & 0x7fffffff));
      local_58 = local_58 + (uVar3 & 0x7fffffff);
      uVar8 = uVar8 + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  } while (0 < (int)uVar3);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->super_CVFSNode).m_Accessed = lVar4 / 1000000000;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return local_58;
}

Assistant:

size_t Read(char *Buf, size_t Size, size_t CurPos)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);

                        size_t ChunkPos = CurPos / CHUNK_SIZE; //Calculates the beginning chunk.
                        size_t Readed = 0;

                        while (Readed < Size)
                        {
                            if(ChunkPos >= m_Data.size())
                                break;

                            Chunk c = m_Data[ChunkPos];
                            size_t Pos = CurPos - ChunkPos * CHUNK_SIZE;
                            Pos = (Pos > CHUNK_SIZE) ? 0 : Pos;

                            int CopyCount = c->Filled - Pos;
                            CopyCount = CopyCount > Size ? Size : CopyCount;    //Calculate the right copy size.
                            if(CopyCount <= 0)
                                break;

                            memcpy(Buf + Readed, c->Data + Pos, CopyCount);
                            Readed += CopyCount;
                            ChunkPos++;
                        }
                        
                        m_Accessed = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
                        return Readed;
                    }